

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageDelete(Fts5Storage *p,i64 iDel,sqlite3_value **apVal)

{
  sqlite3_stmt *local_38;
  sqlite3_stmt *pDel;
  Fts5Config *pFStack_28;
  int rc;
  Fts5Config *pConfig;
  sqlite3_value **apVal_local;
  i64 iDel_local;
  Fts5Storage *p_local;
  
  pFStack_28 = p->pConfig;
  local_38 = (sqlite3_stmt *)0x0;
  pConfig = (Fts5Config *)apVal;
  apVal_local = (sqlite3_value **)iDel;
  iDel_local = (i64)p;
  pDel._4_4_ = fts5StorageLoadTotals(p,1);
  if (pDel._4_4_ == 0) {
    pDel._4_4_ = fts5StorageDeleteFromIndex
                           ((Fts5Storage *)iDel_local,(i64)apVal_local,(sqlite3_value **)pConfig);
  }
  if (((pDel._4_4_ == 0) && (pFStack_28->bColumnsize != 0)) &&
     (pDel._4_4_ = fts5StorageGetStmt((Fts5Storage *)iDel_local,7,&local_38,(char **)0x0),
     pDel._4_4_ == 0)) {
    sqlite3_bind_int64(local_38,1,(sqlite_int64)apVal_local);
    sqlite3_step(local_38);
    pDel._4_4_ = sqlite3_reset(local_38);
  }
  if (pFStack_28->eContent == 0) {
    if (pDel._4_4_ == 0) {
      pDel._4_4_ = fts5StorageGetStmt((Fts5Storage *)iDel_local,5,&local_38,(char **)0x0);
    }
    if (pDel._4_4_ == 0) {
      sqlite3_bind_int64(local_38,1,(sqlite_int64)apVal_local);
      sqlite3_step(local_38);
      pDel._4_4_ = sqlite3_reset(local_38);
    }
  }
  return pDel._4_4_;
}

Assistant:

static int sqlite3Fts5StorageDelete(Fts5Storage *p, i64 iDel, sqlite3_value **apVal){
  Fts5Config *pConfig = p->pConfig;
  int rc;
  sqlite3_stmt *pDel = 0;

  assert( pConfig->eContent!=FTS5_CONTENT_NORMAL || apVal==0 );
  rc = fts5StorageLoadTotals(p, 1);

  /* Delete the index records */
  if( rc==SQLITE_OK ){
    rc = fts5StorageDeleteFromIndex(p, iDel, apVal);
  }

  /* Delete the %_docsize record */
  if( rc==SQLITE_OK && pConfig->bColumnsize ){
    rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_DOCSIZE, &pDel, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  /* Delete the %_content record */
  if( pConfig->eContent==FTS5_CONTENT_NORMAL ){
    if( rc==SQLITE_OK ){
      rc = fts5StorageGetStmt(p, FTS5_STMT_DELETE_CONTENT, &pDel, 0);
    }
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pDel, 1, iDel);
      sqlite3_step(pDel);
      rc = sqlite3_reset(pDel);
    }
  }

  return rc;
}